

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::erase(sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *this,iterator pos)

{
  bool bVar1;
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_60;
  
  local_60.pos.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_60.pos.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_60.pos.col_current = (nonempty_iterator)0x0;
  local_60.end.col_current = (nonempty_iterator)0x0;
  local_60.ht = this;
  local_60.pos.row_current._M_current = local_60.pos.row_end._M_current;
  local_60.end.row_begin._M_current = local_60.pos.row_begin._M_current;
  local_60.end.row_end._M_current = local_60.pos.row_end._M_current;
  local_60.end.row_current._M_current = local_60.pos.row_end._M_current;
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_60);
  if (((((pos.pos.row_begin._M_current != local_60.pos.row_begin._M_current) ||
        (pos.pos.row_end._M_current != local_60.pos.row_end._M_current)) ||
       (pos.pos.row_current._M_current != local_60.pos.row_current._M_current)) ||
      ((pos.pos.row_current._M_current != pos.pos.row_end._M_current &&
       (pos.pos.col_current != local_60.pos.col_current)))) &&
     (bVar1 = set_deleted(this,&pos), bVar1)) {
    this->num_deleted = this->num_deleted + 1;
    (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = true;
  }
  return;
}

Assistant:

void erase(iterator pos) {
    if (pos == end()) return;  // sanity check
    if (set_deleted(pos)) {    // true if object has been newly deleted
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
    }
  }